

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void helper_fldl_FT0_x86_64(CPUX86State *env,uint64_t val)

{
  floatx80 fVar1;
  
  fVar1 = float64_to_floatx80_x86_64(val,&env->fp_status);
  (env->ft0).low = fVar1.low;
  (env->ft0).high = fVar1.high;
  return;
}

Assistant:

void helper_fldl_FT0(CPUX86State *env, uint64_t val)
{
    union {
        float64 f;
        uint64_t i;
    } u;

    u.i = val;
    FT0 = float64_to_floatx80(u.f, &env->fp_status);
}